

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Appearance_PDU.cpp
# Opt level: O3

void __thiscall
KDIS::PDU::Appearance_PDU::SetAppearanceVisual(Appearance_PDU *this,EntityAppearance *V)

{
  KUINT16 *pKVar1;
  
  if (((this->m_AppearanceFlag1Union).m_ui8Flag & 0x20) == 0) {
    (this->m_AppearanceFlag1Union).m_ui8Flag = (this->m_AppearanceFlag1Union).m_ui8Flag | 0x20;
    pKVar1 = &(this->super_LE_Header).super_Header.super_Header6.m_ui16PDULength;
    *pKVar1 = *pKVar1 + 4;
  }
  (this->m_VisApp).m_Appearance = V->m_Appearance;
  return;
}

Assistant:

void Appearance_PDU::SetAppearanceVisualFlag( KBOOL F )
{
    if( ( KUINT8 )F == m_AppearanceFlag1Union.m_ui8Vis )return;

    m_AppearanceFlag1Union.m_ui8Vis = F;

    if( F )
    {
        m_ui16PDULength += EntityAppearance::ENTITY_APPEARANCE_SIZE;
    }
    else
    {
        m_ui16PDULength -= EntityAppearance::ENTITY_APPEARANCE_SIZE;
    }
}